

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O1

int anon_unknown.dwarf_747f::RtMidi_getportname(lua_State *L)

{
  int iVar1;
  RtMidi *pRVar2;
  string name;
  long *local_38;
  undefined8 local_30;
  long local_28 [2];
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidi");
  pRVar2 = luaGetUserdata<RtMidi>(L,1,"RtMidi");
  iVar1 = luaL_optinteger(L,2,1);
  (*pRVar2->_vptr_RtMidi[3])(&local_38,pRVar2,(ulong)(iVar1 - 1));
  lua_pushlstring(L,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return 1;
}

Assistant:

int RtMidi_getportname(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	auto name = self.getPortName(static_cast<unsigned>(luaL_optinteger(L, 2, 1)) - 1);
	lua_pushlstring(L, name.c_str(), name.size());
	return 1;
}